

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monitor.h
# Opt level: O2

void __thiscall Monitor::start(Monitor *this)

{
  this->stopped = 0;
  gettimeofday((timeval *)&this->startCount,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

inline void start() {
		stopped = 0; // reset stop flag
		#ifdef _WIN32
		QueryPerformanceCounter(&startCount);
		#else
		gettimeofday(&startCount, NULL);
		#endif
	}